

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void unique_ptr_test(void)

{
  long lVar1;
  Xxx *pXVar2;
  ostream *poVar3;
  long in_FS_OFFSET;
  unique_ptr<Xxx> local_50;
  vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_> PtrVec;
  unique_ptr<Xxx> local_30;
  unique_ptr<Xxx> yPtr;
  unique_ptr<Xxx> xPtr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  xPtr.px = (Xxx *)0x0;
  std::operator<<((ostream *)&std::cout,"unique_ptr_test: in\n");
  if (xPtr.px == (Xxx *)0x0) {
    pXVar2 = (Xxx *)operator_new(0x10);
    Xxx::Xxx(pXVar2,0x400);
    yPtr.px = pXVar2;
    poVar3 = std::operator<<((ostream *)&std::cout,"yPtr=");
    poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    if (yPtr.px != (Xxx *)0x0) {
      pXVar2 = unique_ptr<Xxx>::operator->(&yPtr);
      Xxx::doSomething(pXVar2);
      local_30 = xPtr;
      xPtr = yPtr;
      yPtr.px = (Xxx *)0x0;
      unique_ptr<Xxx>::destroy(&local_30);
      poVar3 = std::operator<<((ostream *)&std::cout,"xPtr=");
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"yPtr=");
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      PtrVec.super__Vector_base<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      PtrVec.super__Vector_base<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      PtrVec.super__Vector_base<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>::push_back(&PtrVec,&xPtr);
      poVar3 = std::operator<<((ostream *)&std::cout,"xPtr=");
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>::~vector(&PtrVec);
      unique_ptr<Xxx>::destroy(&yPtr);
      poVar3 = std::operator<<((ostream *)&std::cout,"xPtr=");
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      PtrVec.super__Vector_base<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      PtrVec.super__Vector_base<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      PtrVec.super__Vector_base<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>::push_back(&PtrVec,&xPtr);
      poVar3 = std::operator<<((ostream *)&std::cout,"PtrList.back=");
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"xPtr=");
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      pXVar2 = PtrVec.super__Vector_base<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>._M_impl
               .super__Vector_impl_data._M_finish[-1].px;
      PtrVec.super__Vector_base<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].px = (Xxx *)0x0;
      local_50.px = xPtr.px;
      xPtr.px = pXVar2;
      unique_ptr<Xxx>::destroy(&local_50);
      poVar3 = std::operator<<((ostream *)&std::cout,"xPtr=");
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>::~vector(&PtrVec);
      poVar3 = std::operator<<((ostream *)&std::cout,"xPtr=");
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::operator<<((ostream *)&std::cout,"unique_ptr_test: out\n");
      unique_ptr<Xxx>::destroy(&xPtr);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
  }
  abort();
}

Assistant:

void unique_ptr_test(void)
{
    // Create an empty (ie. NULL) unique_ptr
    unique_ptr<Xxx> xPtr;

    std::cout << "unique_ptr_test: in\n";

    if (xPtr) // empty pointer
    {
        abort(); // impossible
    }
    else
    {
        // Create a new Xxx object, and give its ownership to the yPtr unique_ptr
        unique_ptr<Xxx> yPtr(new Xxx(1024));
        // Same as :
        //unique_ptr<Xxx> yPtr;
        //yPtr.reset(new Xxx(1024));

        std::cout << "yPtr=" << yPtr.get() << std::endl;
        if (yPtr) // valid pointer
        {
            // Access members functions/variables like with a raw pointer
            yPtr->doSomething();
        }
        else
        {
            abort(); // impossible
        }

        // Transfer ownership by making a copy of the unique_ptr
        xPtr = move(yPtr);
        std::cout << "xPtr=" << xPtr.get() << std::endl;
        std::cout << "yPtr=" << yPtr.get() << std::endl;

        std::vector<unique_ptr<Xxx> > PtrVec;
        PtrVec.push_back(xPtr);
        std::cout << "xPtr=" << xPtr.get() << std::endl;

    } // yPtr is destroyed, but xPtr retains the ownership of the object

    std::cout << "xPtr=" << xPtr.get() << std::endl;

    {
        std::vector<unique_ptr<Xxx> > PtrList;
        PtrList.push_back(move(xPtr)); // Transfer ownership to the vector

        std::cout << "PtrList.back=" << PtrList.back().get() << std::endl;
        std::cout << "xPtr=" << xPtr.get() << std::endl;

        xPtr = PtrList.back(); // Get back ownership from the vector

        std::cout << "xPtr=" << xPtr.get() << std::endl;
    }

    std::cout << "xPtr=" << xPtr.get() << std::endl;

    std::cout << "unique_ptr_test: out\n";

    // Same as :
    //xPtr.reset();
}